

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleApplicationError
          (HttpServerErrorHandler *this,Exception *exception,
          Maybe<kj::HttpService::Response_&> *response)

{
  int iVar1;
  char *pcVar2;
  char *node;
  size_t sVar3;
  Disposer *pDVar4;
  AsyncOutputStream *pAVar5;
  PromiseArenaMember *pPVar6;
  char *in_RCX;
  undefined1 *puVar7;
  PromiseArenaMember *pPVar8;
  long lVar9;
  StringPtr value;
  String errorMessage;
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  HttpHeaders headers;
  HttpHeaderTable headerTable;
  String local_138;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_118;
  ArrayDisposer *local_108;
  PromiseArenaMember *local_f8;
  PromiseArenaMember *pPStack_f0;
  HttpHeaders local_e8;
  undefined1 local_88 [8];
  undefined1 *local_80;
  undefined1 local_78 [8];
  undefined1 *local_70;
  undefined1 local_68 [8];
  undefined1 *local_60;
  HttpHeaderTable local_58;
  
  if (*(int *)((long)&response[4].ptr + 4) != 2) {
    pcVar2 = (((Exception *)in_RCX)->ownFile).content.ptr;
    if (pcVar2 != (char *)0x0) {
      if (kj::_::Debug::minSeverity < 1) {
        in_RCX = "\"threw exception while serving HTTP response\", exception";
        kj::_::Debug::log<char_const(&)[44],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x206c,INFO,"\"threw exception while serving HTTP response\", exception",
                   (char (*) [44])"threw exception while serving HTTP response",
                   (Exception *)response);
      }
      HttpHeaderTable::HttpHeaderTable(&local_58);
      HttpHeaders::HttpHeaders(&local_e8,&local_58);
      value.content.size_ = 0xb;
      value.content.ptr = "text/plain";
      anon_unknown_36::requireValidHeaderValue(value);
      local_e8.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
      local_e8.indexedHeaders.ptr[0xe].content.size_ = 0xb;
      local_118.disposer = (Disposer *)0x0;
      local_118.ptr = (AsyncOutputStream *)0x0;
      local_108 = (ArrayDisposer *)0x0;
      local_f8 = (PromiseArenaMember *)0x0;
      pPStack_f0 = (PromiseArenaMember *)0x0;
      iVar1 = *(int *)((long)&response[4].ptr + 4);
      if (iVar1 == 3) {
        str<char_const(&)[64],kj::Exception&>
                  (&local_138,
                   (kj *)"ERROR: The server does not implement this operation. Details:\n\n",
                   (char (*) [64])response,(Exception *)in_RCX);
        pAVar5 = local_118.ptr;
        pDVar4 = local_118.disposer;
        if (local_118.disposer != (Disposer *)0x0) {
          local_118.disposer = (Disposer *)0x0;
          local_118.ptr = (AsyncOutputStream *)0x0;
          (*(code *)*local_108->_vptr_ArrayDisposer)(local_108,pDVar4,1,pAVar5,pAVar5,0);
        }
        local_118.disposer = (Disposer *)local_138.content.ptr;
        local_118.ptr = (AsyncOutputStream *)local_138.content.size_;
        local_108 = local_138.content.disposer;
        local_70 = (undefined1 *)0x0;
        if ((PromiseArenaMember *)local_138.content.size_ != (PromiseArenaMember *)0x0) {
          local_70 = (undefined1 *)
                     ((long)&((PromiseArenaMember *)(local_138.content.size_ + -0x10))->arena + 7);
        }
        local_78[0] = 1;
        (*(code *)**(undefined8 **)pcVar2)
                  (&local_138,pcVar2,0x1f5,"Not Implemented",0x10,&local_e8,local_78);
        pPVar8 = (PromiseArenaMember *)local_138.content.size_;
        local_138.content.size_ = 0;
        pPVar6 = (PromiseArenaMember *)local_138.content.ptr;
        if (pPStack_f0 != (PromiseArenaMember *)0x0) {
          lVar9 = (long)pPStack_f0 + *(long *)(*(long *)pPStack_f0 + -0x10);
          pPStack_f0 = pPVar8;
          (*(code *)*local_f8->_vptr_PromiseArenaMember)(local_f8,lVar9);
          local_f8 = pPVar6;
          pPVar6 = local_f8;
          pPVar8 = pPStack_f0;
        }
        pPStack_f0 = pPVar8;
        local_f8 = pPVar6;
        sVar3 = local_138.content.size_;
        if ((PromiseArenaMember *)local_138.content.size_ != (PromiseArenaMember *)0x0) {
          local_138.content.size_ = 0;
          (***(_func_int ***)local_138.content.ptr)
                    (local_138.content.ptr,
                     (_func_int *)((long)(_func_int ***)sVar3 + (long)(*(_func_int ***)sVar3)[-2]));
        }
      }
      else if (iVar1 == 1) {
        str<char_const(&)[75],kj::Exception&>
                  (&local_138,
                   (kj *)
                   "ERROR: The server is temporarily unable to handle your request. Details:\n\n",
                   (char (*) [75])response,(Exception *)in_RCX);
        pAVar5 = local_118.ptr;
        pDVar4 = local_118.disposer;
        if (local_118.disposer != (Disposer *)0x0) {
          local_118.disposer = (Disposer *)0x0;
          local_118.ptr = (AsyncOutputStream *)0x0;
          (*(code *)*local_108->_vptr_ArrayDisposer)(local_108,pDVar4,1,pAVar5,pAVar5,0);
        }
        local_118.disposer = (Disposer *)local_138.content.ptr;
        local_118.ptr = (AsyncOutputStream *)local_138.content.size_;
        local_108 = local_138.content.disposer;
        local_60 = (undefined1 *)0x0;
        if ((PromiseArenaMember *)local_138.content.size_ != (PromiseArenaMember *)0x0) {
          local_60 = (undefined1 *)
                     ((long)&((PromiseArenaMember *)(local_138.content.size_ + -0x10))->arena + 7);
        }
        local_68[0] = 1;
        (*(code *)**(undefined8 **)pcVar2)
                  (&local_138,pcVar2,0x1f7,"Service Unavailable",0x14,&local_e8,local_68);
        pPVar8 = (PromiseArenaMember *)local_138.content.size_;
        local_138.content.size_ = 0;
        pPVar6 = (PromiseArenaMember *)local_138.content.ptr;
        if (pPStack_f0 != (PromiseArenaMember *)0x0) {
          lVar9 = (long)pPStack_f0 + *(long *)(*(long *)pPStack_f0 + -0x10);
          pPStack_f0 = pPVar8;
          (*(code *)*local_f8->_vptr_PromiseArenaMember)(local_f8,lVar9);
          local_f8 = pPVar6;
          pPVar6 = local_f8;
          pPVar8 = pPStack_f0;
        }
        pPStack_f0 = pPVar8;
        local_f8 = pPVar6;
        sVar3 = local_138.content.size_;
        if ((PromiseArenaMember *)local_138.content.size_ != (PromiseArenaMember *)0x0) {
          local_138.content.size_ = 0;
          (***(_func_int ***)local_138.content.ptr)
                    (local_138.content.ptr,
                     (_func_int *)((long)(_func_int ***)sVar3 + (long)(*(_func_int ***)sVar3)[-2]));
        }
      }
      else {
        str<char_const(&)[49],kj::Exception&>
                  (&local_138,(kj *)"ERROR: The server threw an exception. Details:\n\n",
                   (char (*) [49])response,(Exception *)in_RCX);
        pAVar5 = local_118.ptr;
        pDVar4 = local_118.disposer;
        if (local_118.disposer != (Disposer *)0x0) {
          local_118.disposer = (Disposer *)0x0;
          local_118.ptr = (AsyncOutputStream *)0x0;
          (*(code *)*local_108->_vptr_ArrayDisposer)(local_108,pDVar4,1,pAVar5,pAVar5,0);
        }
        local_118.disposer = (Disposer *)local_138.content.ptr;
        local_118.ptr = (AsyncOutputStream *)local_138.content.size_;
        local_108 = local_138.content.disposer;
        local_80 = (undefined1 *)0x0;
        if ((PromiseArenaMember *)local_138.content.size_ != (PromiseArenaMember *)0x0) {
          local_80 = (undefined1 *)
                     ((long)&((PromiseArenaMember *)(local_138.content.size_ + -0x10))->arena + 7);
        }
        local_88[0] = 1;
        (*(code *)**(undefined8 **)pcVar2)
                  (&local_138,pcVar2,500,"Internal Server Error",0x16,&local_e8,local_88);
        pPVar8 = (PromiseArenaMember *)local_138.content.size_;
        local_138.content.size_ = 0;
        pPVar6 = (PromiseArenaMember *)local_138.content.ptr;
        if (pPStack_f0 != (PromiseArenaMember *)0x0) {
          lVar9 = (long)pPStack_f0 + *(long *)(*(long *)pPStack_f0 + -0x10);
          pPStack_f0 = pPVar8;
          (*(code *)*local_f8->_vptr_PromiseArenaMember)(local_f8,lVar9);
          local_f8 = pPVar6;
          pPVar6 = local_f8;
          pPVar8 = pPStack_f0;
        }
        pPStack_f0 = pPVar8;
        local_f8 = pPVar6;
        sVar3 = local_138.content.size_;
        if ((PromiseArenaMember *)local_138.content.size_ != (PromiseArenaMember *)0x0) {
          local_138.content.size_ = 0;
          (***(_func_int ***)local_138.content.ptr)
                    (local_138.content.ptr,
                     (_func_int *)((long)(_func_int ***)sVar3 + (long)(*(_func_int ***)sVar3)[-2]));
        }
      }
      pPVar8 = (PromiseArenaMember *)local_118.ptr;
      if ((PromiseArenaMember *)local_118.ptr != (PromiseArenaMember *)0x0) {
        pPVar8 = (PromiseArenaMember *)local_118.disposer;
      }
      puVar7 = (undefined1 *)0x0;
      if ((PromiseArenaMember *)local_118.ptr != (PromiseArenaMember *)0x0) {
        puVar7 = (undefined1 *)
                 ((long)&((PromiseArenaMember *)((long)local_118.ptr + -0x10))->arena + 7);
      }
      (**pPStack_f0->_vptr_PromiseArenaMember)(&local_138,pPStack_f0,pPVar8,puVar7);
      Promise<void>::attach<kj::String,kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                ((Promise<void> *)this,&local_138,&local_118);
      node = local_138.content.ptr;
      if ((PromiseArenaMember *)local_138.content.ptr != (PromiseArenaMember *)0x0) {
        local_138.content.ptr = (char *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
      pPVar8 = pPStack_f0;
      if (pPStack_f0 != (PromiseArenaMember *)0x0) {
        pPStack_f0 = (PromiseArenaMember *)0x0;
        (**local_f8->_vptr_PromiseArenaMember)
                  (local_f8,(_func_int *)
                            ((long)&pPVar8->_vptr_PromiseArenaMember +
                            (long)pPVar8->_vptr_PromiseArenaMember[-2]));
      }
      pAVar5 = local_118.ptr;
      pDVar4 = local_118.disposer;
      if ((PromiseArenaMember *)local_118.disposer != (PromiseArenaMember *)0x0) {
        local_118.disposer = (Disposer *)0x0;
        local_118.ptr = (AsyncOutputStream *)0x0;
        (**local_108->_vptr_ArrayDisposer)(local_108,pDVar4,1,pAVar5,pAVar5,0);
      }
      HttpHeaders::~HttpHeaders(&local_e8);
      HttpHeaderTable::~HttpHeaderTable(&local_58);
      if (pcVar2 != (char *)0x0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[64],char_const(&)[35],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x2087,ERROR,
                 "\"HttpService threw exception after generating a partial response\", \"too late to report error to client\", exception"
                 ,(char (*) [64])"HttpService threw exception after generating a partial response",
                 (char (*) [35])"too late to report error to client",(Exception *)response);
    }
  }
  kj::_::readyNow();
  this->_vptr_HttpServerErrorHandler = (_func_int **)local_e8.table;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleApplicationError(
    kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) {
  // Default error handler implementation.

  if (exception.getType() == kj::Exception::Type::DISCONNECTED) {
    // How do we tell an HTTP client that there was a transient network error, and it should
    // try again immediately? There's no HTTP status code for this (503 is meant for "try
    // again later, not now"). Here's an idea: Don't send any response; just close the
    // connection, so that it looks like the connection between the HTTP client and server
    // was dropped. A good client should treat this exactly the way we want.
    //
    // We also bail here to avoid logging the disconnection, which isn't very interesting.
    return kj::READY_NOW;
  }

  KJ_IF_SOME(r, response) {
    KJ_LOG(INFO, "threw exception while serving HTTP response", exception);

    HttpHeaderTable headerTable {};
    HttpHeaders headers(headerTable);
    headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    kj::String errorMessage;
    kj::Own<AsyncOutputStream> body;

    if (exception.getType() == kj::Exception::Type::OVERLOADED) {
      errorMessage = kj::str(
          "ERROR: The server is temporarily unable to handle your request. Details:\n\n", exception);
      body = r.send(503, "Service Unavailable", headers, errorMessage.size());
    } else if (exception.getType() == kj::Exception::Type::UNIMPLEMENTED) {
      errorMessage = kj::str(
          "ERROR: The server does not implement this operation. Details:\n\n", exception);
      body = r.send(501, "Not Implemented", headers, errorMessage.size());
    } else {
      errorMessage = kj::str(
          "ERROR: The server threw an exception. Details:\n\n", exception);
      body = r.send(500, "Internal Server Error", headers, errorMessage.size());
    }

    return body->write(errorMessage.asBytes()).attach(kj::mv(errorMessage), kj::mv(body));
  }

  KJ_LOG(ERROR, "HttpService threw exception after generating a partial response",
                "too late to report error to client", exception);
  return kj::READY_NOW;
}